

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall BoardView::Update(BoardView *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  undefined8 uVar5;
  element_type *peVar6;
  undefined8 uVar7;
  ImGuiIO *pIVar8;
  BoardView *this_00;
  BoardView *in_RDI;
  float fVar9;
  float fVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  Program *in_stack_00000130;
  ImVec2 s;
  ImVec2 pos;
  ImVec2 spos;
  shared_ptr<Pin> pin;
  ImGuiWindowFlags draw_surface_flags;
  ImGuiWindowFlags flags;
  ImGuiIO *io_1;
  path filepath;
  int i;
  ImGuiIO *io;
  char *preset_filename;
  bool open_file;
  int in_stack_00002dec;
  BoardView *in_stack_00002df0;
  undefined4 in_stack_fffffffffffff4c8;
  undefined4 in_stack_fffffffffffff4cc;
  undefined4 in_stack_fffffffffffff4d0;
  float in_stack_fffffffffffff4d4;
  path *in_stack_fffffffffffff4d8;
  float w;
  BackgroundImage *this_01;
  FHistory *in_stack_fffffffffffff4e0;
  BoardView *in_stack_fffffffffffff4e8;
  BoardView *in_stack_fffffffffffff4f0;
  KeyBindings *in_stack_fffffffffffff4f8;
  BoardView *in_stack_fffffffffffff500;
  float in_stack_fffffffffffff508;
  float in_stack_fffffffffffff50c;
  uint uVar11;
  undefined4 in_stack_fffffffffffff510;
  undefined4 in_stack_fffffffffffff514;
  undefined8 in_stack_fffffffffffff528;
  undefined1 uVar12;
  bool *in_stack_fffffffffffff530;
  allocator<char> *selected;
  string *in_stack_fffffffffffff538;
  string *shortcut;
  BoardSettings *in_stack_fffffffffffff540;
  undefined7 in_stack_fffffffffffff550;
  byte in_stack_fffffffffffff557;
  undefined7 in_stack_fffffffffffff590;
  undefined1 in_stack_fffffffffffff597;
  KeyBindings *in_stack_fffffffffffff598;
  KeyBindings *this_02;
  BoardView *in_stack_fffffffffffff5d0;
  string *in_stack_fffffffffffff600;
  undefined7 in_stack_fffffffffffff608;
  byte in_stack_fffffffffffff60f;
  Color *in_stack_fffffffffffff630;
  BoardView *in_stack_fffffffffffff6c0;
  ImVec2 local_890;
  ImVec2 local_888;
  ImVec2 local_880;
  ImVec2 local_878;
  ImVec2 local_870;
  ImVec2 local_868;
  ImVec2 local_860;
  string local_858 [24];
  Keyboard *in_stack_fffffffffffff7c0;
  undefined1 local_838 [24];
  ImVec2 local_820;
  ImVec2 local_818;
  undefined8 in_stack_fffffffffffff7f0;
  undefined4 in_stack_fffffffffffff7f8;
  undefined4 in_stack_fffffffffffff7fc;
  ImVec2 local_800;
  ImGuiIO *local_7f8;
  path local_7f0 [2];
  path local_7a0;
  ImVec2 local_774;
  ImVec2 local_76c;
  ImVec2 local_764;
  ImVec2 local_75c;
  ImVec2 local_754;
  ImVec2 local_74c;
  ImVec2 local_744;
  ImVec2 local_73c;
  ImVec2 local_734;
  ImVec2 local_72c;
  ImVec2 local_724;
  ImVec2 local_71c;
  ImVec2 local_714;
  ImVec2 local_70c;
  allocator<char> local_701;
  BoardView *in_stack_fffffffffffff900;
  ImGuiWindowFlags in_stack_fffffffffffff91c;
  bool *in_stack_fffffffffffff920;
  char *in_stack_fffffffffffff928;
  allocator<char> local_6b9;
  string local_6b8 [39];
  undefined1 local_691 [33];
  string local_670 [39];
  allocator<char> local_649;
  string local_648 [39];
  allocator<char> local_621;
  string local_620 [32];
  string local_600 [39];
  allocator<char> local_5d9;
  string local_5d8 [32];
  string local_5b8 [39];
  allocator<char> local_591;
  string local_590 [32];
  string local_570 [39];
  undefined1 local_549 [33];
  string local_528 [39];
  allocator<char> local_501;
  string local_500 [32];
  string local_4e0 [39];
  allocator<char> local_4b9;
  string local_4b8 [32];
  undefined1 local_498 [8];
  BoardView *in_stack_fffffffffffffb70;
  string local_470 [32];
  string local_450 [39];
  allocator<char> local_429;
  string local_428 [32];
  string local_408 [39];
  allocator<char> local_3e1;
  string local_3e0 [39];
  allocator<char> local_3b9;
  string local_3b8 [32];
  string local_398 [39];
  undefined1 local_371 [33];
  string local_350 [39];
  allocator<char> local_329;
  string local_328 [32];
  string local_308 [39];
  allocator<char> local_2e1;
  string local_2e0 [39];
  allocator<char> local_2b9;
  string local_2b8 [32];
  string local_298 [39];
  allocator<char> local_271;
  string local_270 [32];
  string local_250 [39];
  allocator<char> local_229;
  string local_228 [32];
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [32];
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [32];
  string local_178 [39];
  allocator<char> local_151;
  string local_150 [32];
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [32];
  string local_e8 [32];
  int local_c8;
  allocator<char> local_c1;
  string local_c0 [32];
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  ImGuiIO *local_20;
  char (*local_18) [2048];
  byte local_9;
  
  local_9 = 0;
  local_18 = (char (*) [2048])0x0;
  local_20 = ImGui::GetIO();
  if ((0.0 < (local_20->DisplaySize).x) && (0.0 < (local_20->DisplaySize).y)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
               (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
               (allocator<char> *)in_stack_fffffffffffff500);
    bVar1 = KeyBindings::isPressed(in_stack_fffffffffffff4f8,(string *)in_stack_fffffffffffff4f0);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
    if (bVar1) {
      local_9 = 1;
      ImGuiIO::AddKeyEvent
                ((ImGuiIO *)in_stack_fffffffffffff4e0,
                 (ImGuiKey)((ulong)in_stack_fffffffffffff4d8 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffff4d8 >> 0x18,0));
      ImGuiIO::AddKeyEvent
                ((ImGuiIO *)in_stack_fffffffffffff4e0,
                 (ImGuiKey)((ulong)in_stack_fffffffffffff4d8 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffff4d8 >> 0x18,0));
      ImGuiIO::AddKeyEvent
                ((ImGuiIO *)in_stack_fffffffffffff4e0,
                 (ImGuiKey)((ulong)in_stack_fffffffffffff4d8 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffff4d8 >> 0x18,0));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
               (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
               (allocator<char> *)in_stack_fffffffffffff500);
    bVar1 = KeyBindings::isPressed(in_stack_fffffffffffff4f8,(string *)in_stack_fffffffffffff4f0);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
    if (bVar1) {
      in_RDI->m_wantsQuit = true;
    }
    bVar1 = ImGui::BeginMainMenuBar();
    if (bVar1) {
      fVar9 = ImGui::GetWindowHeight();
      in_RDI->m_menu_height = fVar9;
      SearchComponent(in_stack_fffffffffffff6c0);
      ContextMenu(in_stack_fffffffffffff900);
      bVar1 = ImGui::BeginMenu((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0)
                               ,SUB41((uint)in_stack_fffffffffffff4cc >> 0x18,0));
      uVar12 = (undefined1)((ulong)in_stack_fffffffffffff528 >> 0x38);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        KeyBindings::getKeyNames
                  (in_stack_fffffffffffff598,
                   (string *)CONCAT17(in_stack_fffffffffffff597,in_stack_fffffffffffff590));
        std::__cxx11::string::c_str();
        bVar1 = ImGui::MenuItem((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0
                                                ),
                                (char *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8
                                                ),false,false);
        std::__cxx11::string::~string(local_a0);
        std::__cxx11::string::~string(local_c0);
        std::allocator<char>::~allocator(&local_c1);
        if (bVar1) {
          local_9 = 1;
        }
        ImGui::Separator();
        for (local_c8 = 0; uVar12 = (undefined1)((ulong)in_stack_fffffffffffff528 >> 0x38),
            local_c8 < (in_RDI->fhistory).count; local_c8 = local_c8 + 1) {
          FHistory::Trim_filename
                    (in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                     (int)in_stack_fffffffffffff4d4);
          bVar1 = ImGui::MenuItem((char *)CONCAT44(in_stack_fffffffffffff4d4,
                                                   in_stack_fffffffffffff4d0),
                                  (char *)CONCAT44(in_stack_fffffffffffff4cc,
                                                   in_stack_fffffffffffff4c8),false,false);
          if (bVar1) {
            local_9 = 1;
            local_18 = (in_RDI->fhistory).history + local_c8;
          }
        }
        ImGui::Separator();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        KeyBindings::getKeyNames
                  (in_stack_fffffffffffff598,
                   (string *)CONCAT17(in_stack_fffffffffffff597,in_stack_fffffffffffff590));
        std::__cxx11::string::c_str();
        bVar1 = ImGui::MenuItem((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0
                                                ),
                                (char *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8
                                                ),false,false);
        std::__cxx11::string::~string(local_e8);
        std::__cxx11::string::~string(local_108);
        std::allocator<char>::~allocator(&local_109);
        if ((bVar1) && ((in_RDI->m_validBoard & 1U) != 0)) {
          in_RDI->m_showSearch = true;
        }
        ImGui::Separator();
        Preferences::Program::menuItem
                  ((Program *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
        Preferences::Color::menuItem
                  ((Color *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
        Preferences::Keyboard::menuItem
                  ((Keyboard *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
        Preferences::BoardSettings::menuItem
                  ((BoardSettings *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
        ImGui::Separator();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        KeyBindings::getKeyNames
                  (in_stack_fffffffffffff598,
                   (string *)CONCAT17(in_stack_fffffffffffff597,in_stack_fffffffffffff590));
        std::__cxx11::string::c_str();
        bVar1 = ImGui::MenuItem((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0
                                                ),
                                (char *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8
                                                ),false,false);
        std::__cxx11::string::~string(local_130);
        std::__cxx11::string::~string(local_150);
        std::allocator<char>::~allocator(&local_151);
        if (bVar1) {
          in_RDI->m_wantsQuit = true;
        }
        ImGui::EndMenu();
      }
      bVar1 = ImGui::BeginMenu((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0)
                               ,SUB41((uint)in_stack_fffffffffffff4cc >> 0x18,0));
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        KeyBindings::getKeyNames
                  (in_stack_fffffffffffff598,
                   (string *)CONCAT17(in_stack_fffffffffffff597,in_stack_fffffffffffff590));
        std::__cxx11::string::c_str();
        bVar1 = ImGui::MenuItem((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0
                                                ),
                                (char *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8
                                                ),false,false);
        std::__cxx11::string::~string(local_178);
        std::__cxx11::string::~string(local_198);
        std::allocator<char>::~allocator(&local_199);
        if (bVar1) {
          FlipBoard(in_stack_00002df0,in_stack_00002dec);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        KeyBindings::getKeyNames
                  (in_stack_fffffffffffff598,
                   (string *)CONCAT17(in_stack_fffffffffffff597,in_stack_fffffffffffff590));
        std::__cxx11::string::c_str();
        bVar1 = ImGui::MenuItem((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0
                                                ),
                                (char *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8
                                                ),false,false);
        std::__cxx11::string::~string(local_1c0);
        std::__cxx11::string::~string(local_1e0);
        std::allocator<char>::~allocator(&local_1e1);
        if (bVar1) {
          Rotate(in_RDI,1);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        KeyBindings::getKeyNames
                  (in_stack_fffffffffffff598,
                   (string *)CONCAT17(in_stack_fffffffffffff597,in_stack_fffffffffffff590));
        std::__cxx11::string::c_str();
        bVar1 = ImGui::MenuItem((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0
                                                ),
                                (char *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8
                                                ),false,false);
        std::__cxx11::string::~string(local_208);
        std::__cxx11::string::~string(local_228);
        std::allocator<char>::~allocator(&local_229);
        if (bVar1) {
          Rotate(in_RDI,-1);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        KeyBindings::getKeyNames
                  (in_stack_fffffffffffff598,
                   (string *)CONCAT17(in_stack_fffffffffffff597,in_stack_fffffffffffff590));
        std::__cxx11::string::c_str();
        bVar1 = ImGui::MenuItem((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0
                                                ),
                                (char *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8
                                                ),false,false);
        std::__cxx11::string::~string(local_250);
        std::__cxx11::string::~string(local_270);
        std::allocator<char>::~allocator(&local_271);
        if (bVar1) {
          CenterView(in_stack_fffffffffffff4f0);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        KeyBindings::getKeyNames
                  (in_stack_fffffffffffff598,
                   (string *)CONCAT17(in_stack_fffffffffffff597,in_stack_fffffffffffff590));
        std::__cxx11::string::c_str();
        bVar1 = ImGui::MenuItem((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0
                                                ),
                                (char *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8
                                                ),false,false);
        std::__cxx11::string::~string(local_298);
        std::__cxx11::string::~string(local_2b8);
        std::allocator<char>::~allocator(&local_2b9);
        if (bVar1) {
          Mirror(in_stack_fffffffffffff5d0);
        }
        ImGui::Separator();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        std::__cxx11::string::string(local_308);
        bVar1 = MenuItemWithCheckbox
                          ((string *)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
                           in_stack_fffffffffffff530,(bool)uVar12);
        std::__cxx11::string::~string(local_308);
        std::__cxx11::string::~string(local_2e0);
        std::allocator<char>::~allocator(&local_2e1);
        if (bVar1) {
          Confparse::WriteBool
                    ((Confparse *)in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                     SUB41((uint)in_stack_fffffffffffff4d4 >> 0x18,0));
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        std::__cxx11::string::string(local_350);
        bVar1 = MenuItemWithCheckbox
                          ((string *)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
                           in_stack_fffffffffffff530,(bool)uVar12);
        std::__cxx11::string::~string(local_350);
        std::__cxx11::string::~string(local_328);
        std::allocator<char>::~allocator(&local_329);
        if (bVar1) {
          Confparse::WriteBool
                    ((Confparse *)in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                     SUB41((uint)in_stack_fffffffffffff4d4 >> 0x18,0));
        }
        in_stack_fffffffffffff630 = (Color *)local_371;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        KeyBindings::getKeyNames
                  (in_stack_fffffffffffff598,
                   (string *)CONCAT17(in_stack_fffffffffffff597,in_stack_fffffffffffff590));
        bVar1 = MenuItemWithCheckbox
                          ((string *)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
                           in_stack_fffffffffffff530,(bool)uVar12);
        std::__cxx11::string::~string(local_398);
        std::__cxx11::string::~string(local_3b8);
        std::allocator<char>::~allocator(&local_3b9);
        std::__cxx11::string::~string((string *)(local_371 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_371);
        if (bVar1) {
          Confparse::WriteBool
                    ((Confparse *)in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                     SUB41((uint)in_stack_fffffffffffff4d4 >> 0x18,0));
          in_RDI->m_needsRedraw = true;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        in_stack_fffffffffffff600 = local_408;
        std::__cxx11::string::string(in_stack_fffffffffffff600);
        in_stack_fffffffffffff60f =
             MenuItemWithCheckbox
                       ((string *)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
                        in_stack_fffffffffffff530,(bool)uVar12);
        std::__cxx11::string::~string(local_408);
        std::__cxx11::string::~string(local_3e0);
        std::allocator<char>::~allocator(&local_3e1);
        if ((in_stack_fffffffffffff60f & 1) != 0) {
          Confparse::WriteBool
                    ((Confparse *)in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                     SUB41((uint)in_stack_fffffffffffff4d4 >> 0x18,0));
          in_RDI->m_needsRedraw = true;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        std::__cxx11::string::string(local_450);
        bVar1 = MenuItemWithCheckbox
                          ((string *)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
                           in_stack_fffffffffffff530,(bool)uVar12);
        std::__cxx11::string::~string(local_450);
        std::__cxx11::string::~string(local_428);
        std::allocator<char>::~allocator(&local_429);
        if (bVar1) {
          Confparse::WriteBool
                    ((Confparse *)in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                     SUB41((uint)in_stack_fffffffffffff4d4 >> 0x18,0));
          in_RDI->m_needsRedraw = true;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        in_stack_fffffffffffff5d0 = (BoardView *)local_498;
        std::__cxx11::string::string((string *)in_stack_fffffffffffff5d0);
        bVar1 = MenuItemWithCheckbox
                          ((string *)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
                           in_stack_fffffffffffff530,(bool)uVar12);
        std::__cxx11::string::~string((string *)local_498);
        std::__cxx11::string::~string(local_470);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb8f);
        if (bVar1) {
          Confparse::WriteBool
                    ((Confparse *)in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                     SUB41((uint)in_stack_fffffffffffff4d4 >> 0x18,0));
          in_RDI->m_needsRedraw = true;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        std::__cxx11::string::string(local_4e0);
        bVar1 = MenuItemWithCheckbox
                          ((string *)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
                           in_stack_fffffffffffff530,(bool)uVar12);
        std::__cxx11::string::~string(local_4e0);
        std::__cxx11::string::~string(local_4b8);
        std::allocator<char>::~allocator(&local_4b9);
        if (bVar1) {
          Confparse::WriteBool
                    ((Confparse *)in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                     SUB41((uint)in_stack_fffffffffffff4d4 >> 0x18,0));
          in_RDI->m_needsRedraw = true;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        std::__cxx11::string::string(local_528);
        bVar1 = MenuItemWithCheckbox
                          ((string *)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
                           in_stack_fffffffffffff530,(bool)uVar12);
        std::__cxx11::string::~string(local_528);
        std::__cxx11::string::~string(local_500);
        std::allocator<char>::~allocator(&local_501);
        if (bVar1) {
          Confparse::WriteBool
                    ((Confparse *)in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                     SUB41((uint)in_stack_fffffffffffff4d4 >> 0x18,0));
          (in_RDI->backgroundImage).enabled = (bool)((in_RDI->config).showBackgroundImage & 1);
        }
        this_02 = (KeyBindings *)local_549;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        std::__cxx11::string::string(local_570);
        bVar2 = MenuItemWithCheckbox
                          ((string *)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
                           in_stack_fffffffffffff530,(bool)uVar12);
        std::__cxx11::string::~string(local_570);
        std::__cxx11::string::~string((string *)(local_549 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_549);
        if ((bVar2 & 1) != 0) {
          Confparse::WriteBool
                    ((Confparse *)in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                     SUB41((uint)in_stack_fffffffffffff4d4 >> 0x18,0));
          in_RDI->m_needsRedraw = true;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        std::__cxx11::string::string(local_5b8);
        bVar1 = MenuItemWithCheckbox
                          ((string *)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
                           in_stack_fffffffffffff530,(bool)uVar12);
        std::__cxx11::string::~string(local_5b8);
        std::__cxx11::string::~string(local_590);
        std::allocator<char>::~allocator(&local_591);
        if (bVar1) {
          Confparse::WriteBool
                    ((Confparse *)in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                     SUB41((uint)in_stack_fffffffffffff4d4 >> 0x18,0));
          in_RDI->m_needsRedraw = true;
        }
        ImGui::Separator();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        KeyBindings::getKeyNames(this_02,(string *)CONCAT17(bVar2,in_stack_fffffffffffff590));
        in_stack_fffffffffffff557 =
             MenuItemWithCheckbox
                       ((string *)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
                        in_stack_fffffffffffff530,(bool)uVar12);
        std::__cxx11::string::~string(local_600);
        std::__cxx11::string::~string(local_620);
        std::allocator<char>::~allocator(&local_621);
        std::__cxx11::string::~string(local_5d8);
        std::allocator<char>::~allocator(&local_5d9);
        if ((in_stack_fffffffffffff557 & 1) != 0) {
          Confparse::WriteBool
                    ((Confparse *)in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                     SUB41((uint)in_stack_fffffffffffff4d4 >> 0x18,0));
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        shortcut = (string *)&in_RDI->keybindings;
        in_stack_fffffffffffff540 = (BoardSettings *)local_691;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        KeyBindings::getKeyNames(this_02,(string *)CONCAT17(bVar2,in_stack_fffffffffffff590));
        MenuItemWithCheckbox
                  ((string *)in_stack_fffffffffffff540,shortcut,in_stack_fffffffffffff530,
                   (bool)uVar12);
        std::__cxx11::string::~string(local_670);
        std::__cxx11::string::~string((string *)(local_691 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_691);
        std::__cxx11::string::~string(local_648);
        std::allocator<char>::~allocator(&local_649);
        selected = &local_6b9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        uVar12 = (undefined1)((ulong)&local_701 >> 0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                   (allocator<char> *)in_stack_fffffffffffff500);
        KeyBindings::getKeyNames(this_02,(string *)CONCAT17(bVar2,in_stack_fffffffffffff590));
        MenuItemWithCheckbox
                  ((string *)in_stack_fffffffffffff540,shortcut,(bool *)selected,(bool)uVar12);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffff920);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffff900);
        std::allocator<char>::~allocator(&local_701);
        std::__cxx11::string::~string(local_6b8);
        std::allocator<char>::~allocator(&local_6b9);
        ImGui::EndMenu();
      }
      bVar1 = ImGui::BeginMenu((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0)
                               ,SUB41((uint)in_stack_fffffffffffff4cc >> 0x18,0));
      if (bVar1) {
        Help::Controls::menuItem
                  ((Controls *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
        Help::About::menuItem
                  ((About *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
        ImGui::EndMenu();
      }
      ImGui::SameLine(0.0,-1.0);
      iVar3 = DPI(10);
      ImVec2::ImVec2(&local_70c,(float)iVar3,1.0);
      ImGui::Dummy((ImVec2 *)in_stack_fffffffffffff4f0);
      ImGui::SameLine(0.0,-1.0);
      bVar1 = ImGui::Checkbox((char *)CONCAT17(in_stack_fffffffffffff60f,in_stack_fffffffffffff608),
                              (bool *)in_stack_fffffffffffff600);
      if (bVar1) {
        Confparse::WriteBool
                  ((Confparse *)in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                   SUB41((uint)in_stack_fffffffffffff4d4 >> 0x18,0));
        in_RDI->m_needsRedraw = true;
      }
      ImGui::SameLine(0.0,-1.0);
      bVar1 = ImGui::Checkbox((char *)CONCAT17(in_stack_fffffffffffff60f,in_stack_fffffffffffff608),
                              (bool *)in_stack_fffffffffffff600);
      if (bVar1) {
        Confparse::WriteBool
                  ((Confparse *)in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                   SUB41((uint)in_stack_fffffffffffff4d4 >> 0x18,0));
        in_RDI->m_needsRedraw = true;
      }
      ImGui::SameLine(0.0,-1.0);
      bVar1 = ImGui::Checkbox((char *)CONCAT17(in_stack_fffffffffffff60f,in_stack_fffffffffffff608),
                              (bool *)in_stack_fffffffffffff600);
      if (bVar1) {
        Confparse::WriteBool
                  ((Confparse *)in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                   SUB41((uint)in_stack_fffffffffffff4d4 >> 0x18,0));
        in_RDI->m_needsRedraw = true;
      }
      ImGui::SameLine(0.0,-1.0);
      bVar1 = ImGui::Checkbox((char *)CONCAT17(in_stack_fffffffffffff60f,in_stack_fffffffffffff608),
                              (bool *)in_stack_fffffffffffff600);
      if (bVar1) {
        Confparse::WriteBool
                  ((Confparse *)in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,
                   SUB41((uint)in_stack_fffffffffffff4d4 >> 0x18,0));
        (in_RDI->backgroundImage).enabled = (bool)((in_RDI->config).showBackgroundImage & 1);
        in_RDI->m_needsRedraw = true;
      }
      ImGui::SameLine(0.0,-1.0);
      iVar3 = DPI(0x28);
      ImVec2::ImVec2(&local_714,(float)iVar3,1.0);
      ImGui::Dummy((ImVec2 *)in_stack_fffffffffffff4f0);
      ImGui::SameLine(0.0,-1.0);
      ImVec2::ImVec2(&local_71c,0.0,0.0);
      bVar1 = ImGui::Button((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8))
      ;
      if (bVar1) {
        Zoom((BoardView *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
             in_stack_fffffffffffff50c,in_stack_fffffffffffff508,
             (float)((ulong)in_stack_fffffffffffff500 >> 0x20));
      }
      ImGui::SameLine(0.0,-1.0);
      ImVec2::ImVec2(&local_724,0.0,0.0);
      bVar1 = ImGui::Button((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8))
      ;
      if (bVar1) {
        Zoom((BoardView *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
             in_stack_fffffffffffff50c,in_stack_fffffffffffff508,
             (float)((ulong)in_stack_fffffffffffff500 >> 0x20));
      }
      ImGui::SameLine(0.0,-1.0);
      iVar3 = DPI(0x14);
      ImVec2::ImVec2(&local_72c,(float)iVar3,1.0);
      ImGui::Dummy((ImVec2 *)in_stack_fffffffffffff4f0);
      ImGui::SameLine(0.0,-1.0);
      ImVec2::ImVec2(&local_734,0.0,0.0);
      bVar1 = ImGui::Button((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8))
      ;
      if (bVar1) {
        Zoom((BoardView *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
             in_stack_fffffffffffff50c,in_stack_fffffffffffff508,
             (float)((ulong)in_stack_fffffffffffff500 >> 0x20));
      }
      ImGui::SameLine(0.0,-1.0);
      ImVec2::ImVec2(&local_73c,0.0,0.0);
      bVar1 = ImGui::Button((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8))
      ;
      if (bVar1) {
        Zoom((BoardView *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
             in_stack_fffffffffffff50c,in_stack_fffffffffffff508,
             (float)((ulong)in_stack_fffffffffffff500 >> 0x20));
      }
      ImGui::SameLine(0.0,-1.0);
      iVar3 = DPI(0x14);
      ImVec2::ImVec2(&local_744,(float)iVar3,1.0);
      ImGui::Dummy((ImVec2 *)in_stack_fffffffffffff4f0);
      ImGui::SameLine(0.0,-1.0);
      ImVec2::ImVec2(&local_74c,0.0,0.0);
      bVar1 = ImGui::Button((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8))
      ;
      if (bVar1) {
        Rotate(in_RDI,-1);
      }
      ImGui::SameLine(0.0,-1.0);
      ImVec2::ImVec2(&local_754,0.0,0.0);
      bVar1 = ImGui::Button((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8))
      ;
      if (bVar1) {
        FlipBoard(in_stack_00002df0,in_stack_00002dec);
      }
      ImGui::SameLine(0.0,-1.0);
      ImVec2::ImVec2(&local_75c,0.0,0.0);
      bVar1 = ImGui::Button((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8))
      ;
      if (bVar1) {
        Rotate(in_RDI,1);
      }
      ImGui::SameLine(0.0,-1.0);
      ImVec2::ImVec2(&local_764,0.0,0.0);
      bVar1 = ImGui::Button((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8))
      ;
      if (bVar1) {
        CenterView(in_stack_fffffffffffff4f0);
      }
      ImGui::SameLine(0.0,-1.0);
      ImVec2::ImVec2(&local_76c,0.0,0.0);
      bVar1 = ImGui::Button((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8))
      ;
      if (bVar1) {
        ClearAllHighlights(in_stack_fffffffffffff500);
      }
      if ((((in_RDI->m_showContextMenu & 1U) != 0) && (in_RDI->m_file != (BRDFileBase *)0x0)) &&
         (((in_RDI->config).showAnnotations & 1U) != 0)) {
        ImGui::OpenPopup((char *)in_stack_fffffffffffff4e0,
                         (ImGuiPopupFlags)((ulong)in_stack_fffffffffffff4d8 >> 0x20));
      }
      Help::About::render((About *)CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550));
      Help::Controls::render((Controls *)in_stack_fffffffffffff5d0);
      Preferences::Program::render(in_stack_00000130);
      bVar1 = Preferences::Color::render(in_stack_fffffffffffff630);
      if (bVar1) {
        in_RDI->m_needsRedraw = true;
      }
      Preferences::Keyboard::render(in_stack_fffffffffffff7c0);
      Preferences::BoardSettings::render(in_stack_fffffffffffff540);
      if (((in_RDI->m_showSearch & 1U) != 0) && (in_RDI->m_file != (BRDFileBase *)0x0)) {
        ImGui::OpenPopup((char *)in_stack_fffffffffffff4e0,
                         (ImGuiPopupFlags)((ulong)in_stack_fffffffffffff4d8 >> 0x20));
      }
      bVar1 = ImGui::BeginPopupModal
                        ((char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                         (bool *)in_stack_fffffffffffff500,
                         (ImGuiWindowFlags)((ulong)in_stack_fffffffffffff4f8 >> 0x20));
      if (bVar1) {
        uVar5 = std::__cxx11::string::c_str();
        ImGui::Text("There was an error opening the file: %s",uVar5);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          uVar5 = std::__cxx11::string::c_str();
          ImGui::Text("%s",uVar5);
        }
        if ((in_RDI->m_file != (BRDFileBase *)0x0) &&
           (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
          uVar5 = std::__cxx11::string::c_str();
          ImGui::Text("%s",uVar5);
        }
        ImVec2::ImVec2(&local_774,0.0,0.0);
        bVar1 = ImGui::Button((char *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                              (ImVec2 *)
                              CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        if (bVar1) {
          ImGui::CloseCurrentPopup();
        }
        ImGui::EndPopup();
      }
      if ((in_RDI->m_lastFileOpenWasInvalid & 1U) != 0) {
        ImGui::OpenPopup((char *)in_stack_fffffffffffff4e0,
                         (ImGuiPopupFlags)((ulong)in_stack_fffffffffffff4d8 >> 0x20));
        in_RDI->m_lastFileOpenWasInvalid = false;
      }
      ImGui::EndMainMenuBar();
    }
    uVar12 = (undefined1)((uint)in_stack_fffffffffffff50c >> 0x18);
    if ((local_9 & 1) != 0) {
      std::filesystem::__cxx11::path::path
                ((path *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
      if (local_18 == (char (*) [2048])0x0) {
        show_file_picker_abi_cxx11_((bool)uVar12);
        std::filesystem::__cxx11::path::operator=(&local_7a0,local_7f0);
        std::filesystem::__cxx11::path::~path
                  ((path *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
        local_7f8 = ImGui::GetIO();
        local_7f8->MouseDown[0] = false;
        local_7f8->MouseClicked[0] = false;
        ImVec2::ImVec2(&local_800,0.0,0.0);
        local_7f8->MouseClickedPos[0] = local_800;
      }
      else {
        std::filesystem::__cxx11::u8path<char*,std::filesystem::__cxx11::path,char>
                  ((char **)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        std::filesystem::__cxx11::path::operator=
                  (in_stack_fffffffffffff4d8,
                   (path *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
        std::filesystem::__cxx11::path::~path
                  ((path *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
        local_18 = (char (*) [2048])0x0;
      }
      bVar1 = std::filesystem::__cxx11::path::empty((path *)0x127ba1);
      if (!bVar1) {
        LoadFile((BoardView *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                 (path *)in_stack_fffffffffffff7f0);
      }
      std::filesystem::__cxx11::path::~path
                ((path *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
    }
    w = (float)((ulong)in_stack_fffffffffffff4d8 >> 0x20);
    fVar9 = DPIF(10.0);
    fVar10 = ImGui::GetFontSize();
    in_RDI->m_status_height = fVar9 + fVar10;
    fVar9 = DPIF(4.0);
    fVar10 = DPIF(3.0);
    ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffff7f0,fVar9,fVar10);
    ImGui::PushStyleVar((ImGuiStyleVar)((ulong)in_stack_fffffffffffff500 >> 0x20),
                        (ImVec2 *)in_stack_fffffffffffff4f8);
    ImGui::PushStyleVar((ImGuiStyleVar)((ulong)in_stack_fffffffffffff4f0 >> 0x20),
                        SUB84(in_stack_fffffffffffff4f0,0));
    ImGui::PushStyleVar((ImGuiStyleVar)((ulong)in_stack_fffffffffffff4f0 >> 0x20),
                        SUB84(in_stack_fffffffffffff4f0,0));
    ImVec2::ImVec2(&local_818,0.0,(local_20->DisplaySize).y - in_RDI->m_status_height);
    ImVec2::ImVec2(&local_820,0.0,0.0);
    ImGui::SetNextWindowPos(&local_818,0,&local_820);
    ImVec2::ImVec2((ImVec2 *)(local_838 + 0x10),(local_20->DisplaySize).x,in_RDI->m_status_height);
    ImGui::SetNextWindowSize((ImVec2 *)(local_838 + 0x10),0);
    ImGui::Begin(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff91c);
    if (((in_RDI->m_file == (BRDFileBase *)0x0) || (in_RDI->m_board == (Board *)0x0)) ||
       (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->m_pinSelected),
       !bVar1)) {
      local_860 = ImGui::GetMousePos();
      local_868 = ScreenToCoord(in_stack_fffffffffffff4e8,
                                (float)((ulong)in_stack_fffffffffffff4e0 >> 0x20),
                                SUB84(in_stack_fffffffffffff4e0,0),w);
      iVar3 = (int)((ulong)in_stack_fffffffffffff4e0 >> 0x20);
      if (((in_RDI->config).showFPS & 1U) == 1) {
        pIVar8 = ImGui::GetIO();
        ImGui::Text((char *)(double)pIVar8->Framerate,"FPS: %0.0f ");
        ImGui::SameLine(0.0,-1.0);
      }
      if ((in_RDI->debug & 1U) != 0) {
        ImGui::Text("AnnID:%d ");
        ImGui::SameLine(0.0,-1.0);
      }
      if (((in_RDI->config).showPosition & 1U) == 1) {
        ImGui::Text((char *)(double)(local_868.x / 1000.0),(double)(local_868.y / 1000.0),
                    (double)local_868.x * 0.0254,(double)local_868.y * 0.0254,
                    "Position: %0.3f\", %0.3f\" (%0.2f, %0.2fmm)");
        ImGui::SameLine(0.0,-1.0);
      }
      if ((in_RDI->m_validBoard & 1U) != 0) {
        local_870 = ImGui::CalcTextSize((char *)in_stack_fffffffffffff4f8,
                                        (char *)in_stack_fffffffffffff4f0,
                                        SUB81((ulong)in_stack_fffffffffffff4e8 >> 0x38,0),
                                        SUB84(in_stack_fffffffffffff4e8,0));
        fVar9 = ImGui::GetWindowWidth();
        ImGui::SameLine((fVar9 - local_870.x) - 20.0,-1.0);
        ImGui::Text("%s");
        ImGui::SameLine(0.0,-1.0);
      }
      ImGui::Text(" ");
    }
    else {
      in_stack_fffffffffffff500 = (BoardView *)local_838;
      std::shared_ptr<Pin>::shared_ptr
                ((shared_ptr<Pin> *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                 (shared_ptr<Pin> *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
      iVar3 = (int)((ulong)in_stack_fffffffffffff4e0 >> 0x20);
      std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x127dc0);
      std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x127dcc);
      in_stack_fffffffffffff4e8 = (BoardView *)std::__cxx11::string::c_str();
      std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x127de7);
      in_stack_fffffffffffff4f0 = (BoardView *)std::__cxx11::string::c_str();
      std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x127e02);
      uVar5 = std::__cxx11::string::c_str();
      peVar6 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x127e1e);
      uVar11 = *(uint *)&(peVar6->net->super_BoardElement).field_0xc;
      std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x127e33);
      std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x127e3f);
      Component::mount_type_str_abi_cxx11_((Component *)CONCAT44(uVar11,in_stack_fffffffffffff508));
      uVar7 = std::__cxx11::string::c_str();
      ImGui::Text("Part: %s   Pin: %s   Net: %s   Probe: %d   (%s.)",in_stack_fffffffffffff4e8,
                  in_stack_fffffffffffff4f0,uVar5,(ulong)uVar11,uVar7);
      std::__cxx11::string::~string(local_858);
      std::shared_ptr<Pin>::~shared_ptr((shared_ptr<Pin> *)0x127e9f);
    }
    ImGui::End();
    ImGui::PopStyleVar(iVar3);
    ImGui::PopStyleVar(iVar3);
    ImGui::PopStyleVar(iVar3);
    if (((in_RDI->config).showInfoPanel & 1U) == 0) {
      ImVec2::ImVec2(&local_878,(local_20->DisplaySize).x,
                     (local_20->DisplaySize).y - (in_RDI->m_status_height + in_RDI->m_menu_height));
      in_RDI->m_board_surface = local_878;
    }
    else {
      ImVec2::ImVec2(&local_880,(local_20->DisplaySize).x - (in_RDI->m_info_surface).x,
                     (local_20->DisplaySize).y - (in_RDI->m_status_height + in_RDI->m_menu_height));
      in_RDI->m_board_surface = local_880;
    }
    ImVec2::ImVec2(&local_888,0.0,in_RDI->m_menu_height);
    ImVec2::ImVec2(&local_890,0.0,0.0);
    ImGui::SetNextWindowPos(&local_888,0,&local_890);
    fVar9 = (local_20->DisplaySize).x;
    if (((fVar9 != in_RDI->m_lastWidth) || (NAN(fVar9) || NAN(in_RDI->m_lastWidth))) ||
       ((fVar9 = (local_20->DisplaySize).y, fVar9 != in_RDI->m_lastHeight ||
        (NAN(fVar9) || NAN(in_RDI->m_lastHeight))))) {
      in_RDI->m_lastWidth = (in_RDI->m_board_surface).x;
      in_RDI->m_lastHeight = (in_RDI->m_board_surface).y;
      in_RDI->m_needsRedraw = true;
    }
    ImGui::SetNextWindowSize(&in_RDI->m_board_surface,0);
    ImGui::PushStyleVar((ImGuiStyleVar)((ulong)in_stack_fffffffffffff4f0 >> 0x20),
                        SUB84(in_stack_fffffffffffff4f0,0));
    ImGui::PushStyleVar((ImGuiStyleVar)((ulong)in_stack_fffffffffffff4f0 >> 0x20),
                        SUB84(in_stack_fffffffffffff4f0,0));
    ImGui::PushStyleColor
              ((ImGuiCol)((ulong)in_stack_fffffffffffff4f0 >> 0x20),(ImU32)in_stack_fffffffffffff4f0
              );
    ImGui::Begin(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff91c);
    if ((in_RDI->m_validBoard & 1U) != 0) {
      HandleInput(in_stack_fffffffffffffb70);
      this_01 = &in_RDI->backgroundImage;
      this_00 = (BoardView *)ImGui::GetWindowDrawList();
      fVar9 = BackgroundImage::x0((BackgroundImage *)0x128349);
      BackgroundImage::y0(this_01,(double)CONCAT44(extraout_XMM0_Db,fVar9));
      in_stack_fffffffffffff4d0 = 0x3f800000;
      CoordToScreen(in_stack_fffffffffffff4e8,(float)((ulong)this_00 >> 0x20),SUB84(this_00,0),
                    (float)((ulong)this_01 >> 0x20));
      in_stack_fffffffffffff4d4 = BackgroundImage::x1((BackgroundImage *)0x128390);
      BackgroundImage::y1(this_01,(double)CONCAT44(extraout_XMM0_Db_00,in_stack_fffffffffffff4d4));
      CoordToScreen(in_stack_fffffffffffff4e8,(float)((ulong)this_00 >> 0x20),SUB84(this_00,0),
                    (float)((ulong)this_01 >> 0x20));
      BackgroundImage::render
                ((BackgroundImage *)in_stack_fffffffffffff4f0,
                 (ImDrawList *)in_stack_fffffffffffff4e8,(ImVec2 *)this_00,(ImVec2 *)this_01,
                 (int)in_stack_fffffffffffff4d4);
      DrawBoard(this_00);
      iVar3 = (int)((ulong)this_00 >> 0x20);
    }
    ImGui::End();
    ImGui::PopStyleColor((int)in_stack_fffffffffffff4d4);
    ImGui::PopStyleVar(iVar3);
    RenderOverlay((BoardView *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0));
    ImGui::PopStyleVar(iVar3);
    HandlePDFBridgeSelection(in_stack_fffffffffffff500);
  }
  return;
}

Assistant:

void BoardView::Update() {
	bool open_file = false;
	// ImGuiIO &io = ImGui::GetIO();
	char *preset_filename = NULL;
	ImGuiIO &io           = ImGui::GetIO();

	// Window is probably minimized, do not attempt to draw anything as our code will not handle screen size of 0 properly and crash (ocornut/imgui@bb2529d)
	if (io.DisplaySize.x <= 0.0f || io.DisplaySize.y <= 0.0f) {
		return;
	}

	/**
	 * ** FIXME
	 * This should be handled in the keyboard section, not here
	 */
	if (keybindings.isPressed("Open")) {
		open_file = true;
		// the dialog will likely eat our WM_KEYUP message for CTRL and O:
		io.AddKeyEvent(ImGuiKey_RightCtrl, false);
		io.AddKeyEvent(ImGuiKey_LeftCtrl, false);
		io.AddKeyEvent(ImGuiKey_O, false);

	}

	if (keybindings.isPressed("Quit")) {
		m_wantsQuit = true;
	}

	if (ImGui::BeginMainMenuBar()) {
		m_menu_height = ImGui::GetWindowHeight();

		/*
		 * Create these dialogs, but they're not actually
		 * visible until they're called up by the respective
		 * flags.
		 */
		SearchComponent();
		ContextMenu();

		if (ImGui::BeginMenu("File")) {
			if (ImGui::MenuItem("Open", keybindings.getKeyNames("Open").c_str())) {
				open_file = true;
			}

			/// Generate file history - PLD20160618-2028
			ImGui::Separator();
			{
				int i;
				for (i = 0; i < fhistory.count; i++) {
					if (ImGui::MenuItem(fhistory.Trim_filename(fhistory.history[i], 2))) {
						open_file       = true;
						preset_filename = fhistory.history[i];
					}
				}
			}
			ImGui::Separator();

			if (ImGui::MenuItem("Part/Net Search", keybindings.getKeyNames("Search").c_str())) {
				if (m_validBoard) m_showSearch = true;
			}

			ImGui::Separator();

			programPreferences.menuItem();
			colorPreferences.menuItem();
			keyboardPreferences.menuItem();
			boardSettings.menuItem();

			ImGui::Separator();

			if (ImGui::MenuItem("Quit", keybindings.getKeyNames("Quit").c_str())) {
				m_wantsQuit = true;
			}
			ImGui::EndMenu();
		}
		if (ImGui::BeginMenu("View")) {
			if (ImGui::MenuItem("Flip board", keybindings.getKeyNames("Flip").c_str())) {
				FlipBoard();
			}
			if (ImGui::MenuItem("Rotate CW", keybindings.getKeyNames("RotateCW").c_str())) {
				Rotate(1);
			}
			if (ImGui::MenuItem("Rotate CCW", keybindings.getKeyNames("RotateCCW").c_str())) {
				Rotate(-1);
			}
			if (ImGui::MenuItem("Reset View", keybindings.getKeyNames("Center").c_str())) {
				CenterView();
			}
			if (ImGui::MenuItem("Mirror Board", keybindings.getKeyNames("Mirror").c_str())) {
				Mirror();
			}

			ImGui::Separator();
			if (MenuItemWithCheckbox("Show FPS", {}, config.showFPS)) {
				obvconfig.WriteBool("showFPS", config.showFPS);
			}

			if (MenuItemWithCheckbox("Show position", {}, config.showPosition)) {
				obvconfig.WriteBool("showPosition", config.showPosition);
			}

			if (MenuItemWithCheckbox("Show pins", keybindings.getKeyNames("TogglePins"), config.showPins)) {
				obvconfig.WriteBool("showPins", config.showPins);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Show net web", {}, config.showNetWeb)) {
				obvconfig.WriteBool("showNetWeb", config.showNetWeb);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Show annotations", {}, config.showAnnotations)) {
				obvconfig.WriteBool("showAnnotations", config.showAnnotations);
				m_needsRedraw = true;
			}


			if (MenuItemWithCheckbox("Show parts name", {}, config.showPartName)) {
				obvconfig.WriteBool("showPartName", config.showPartName);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Show pins name", {}, config.showPinName)) {
				obvconfig.WriteBool("showPinName", config.showPinName);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Show background image", {}, config.showBackgroundImage)) {
				obvconfig.WriteBool("showBackgroundImage", config.showBackgroundImage);
				backgroundImage.enabled = config.showBackgroundImage;
			}

			if (MenuItemWithCheckbox("Fill board", {}, config.boardFill)) {
				obvconfig.WriteBool("boardFill", config.boardFill);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Fill parts", {}, config.fillParts)) {
				obvconfig.WriteBool("fillParts", config.fillParts);
				m_needsRedraw = true;
			}

			ImGui::Separator();

			if (MenuItemWithCheckbox("Info Panel", keybindings.getKeyNames("InfoPanel"), config.showInfoPanel)) {
				obvconfig.WriteBool("showInfoPanel", config.showInfoPanel);
			}
			MenuItemWithCheckbox("Net List", keybindings.getKeyNames("NetList"), m_showNetList);
			MenuItemWithCheckbox("Part List", keybindings.getKeyNames("PartList"), m_showPartList);

			ImGui::EndMenu();
		}

		if (ImGui::BeginMenu("Help##1")) {
			helpControls.menuItem();
			helpAbout.menuItem();

			ImGui::EndMenu();
		}

		ImGui::SameLine();
		ImGui::Dummy(ImVec2(DPI(10), 1));
		ImGui::SameLine();
		if (ImGui::Checkbox("Annotations", &config.showAnnotations)) {
			obvconfig.WriteBool("showAnnotations", config.showAnnotations);
			m_needsRedraw = true;
		}

		ImGui::SameLine();
		if (ImGui::Checkbox("Netweb", &config.showNetWeb)) {
			obvconfig.WriteBool("showNetWeb", config.showNetWeb);
			m_needsRedraw = true;
		}

		ImGui::SameLine();
		{
			if (ImGui::Checkbox("Pins", &config.showPins)) {
				obvconfig.WriteBool("showPins", config.showPins);
				m_needsRedraw = true;
			}
		}

		ImGui::SameLine();
		if (ImGui::Checkbox("Image", &config.showBackgroundImage)) {
			obvconfig.WriteBool("showBackgroundImage", config.showBackgroundImage);
			backgroundImage.enabled = config.showBackgroundImage;
			m_needsRedraw = true;
		}

		ImGui::SameLine();
		ImGui::Dummy(ImVec2(DPI(40), 1));

		ImGui::SameLine();
		if (ImGui::Button(" - ")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, -config.zoomFactor);
		}
		ImGui::SameLine();
		if (ImGui::Button(" + ")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, config.zoomFactor);
		}
		ImGui::SameLine();
		ImGui::Dummy(ImVec2(DPI(20), 1));
		ImGui::SameLine();
		if (ImGui::Button("-")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, -config.zoomFactor / config.zoomModifier);
		}
		ImGui::SameLine();
		if (ImGui::Button("+")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, config.zoomFactor / config.zoomModifier);
		}

		ImGui::SameLine();
		ImGui::Dummy(ImVec2(DPI(20), 1));
		ImGui::SameLine();
		if (ImGui::Button(" < ")) {
			Rotate(-1);
		}

		ImGui::SameLine();
		if (ImGui::Button(" ^ ")) {
			FlipBoard();
		}

		ImGui::SameLine();
		if (ImGui::Button(" > ")) {
			Rotate(1);
		}

		ImGui::SameLine();
		if (ImGui::Button("X")) {
			CenterView();
		}

		ImGui::SameLine();
		if (ImGui::Button("CLEAR")) {
			ClearAllHighlights();
		}

		/*
		ImGui::SameLine();
		ImVec2 tz = ImGui::CalcTextSize("Search             ");
		ImGui::PushItemWidth(-tz.x);
		ImGui::Text("Search");
		ImGui::SameLine();
		ImGui::PushItemWidth(-DPI(1));
		if (ImGui::InputText("##ansearch", m_search, 128, 0)) {
		}
		ImGui::PopItemWidth();
		*/

		if (m_showContextMenu && m_file && config.showAnnotations) {
			ImGui::OpenPopup("Annotations");
		}

		helpAbout.render();
		helpControls.render();

		programPreferences.render();

		if (colorPreferences.render()) {
			m_needsRedraw = true;
		};

		keyboardPreferences.render();
		boardSettings.render();

		if (m_showSearch && m_file) {
			ImGui::OpenPopup("Search for Component / Network");
		}

		if (ImGui::BeginPopupModal("Error opening file")) {
			ImGui::Text("There was an error opening the file: %s", m_lastFileOpenName.c_str());
			if (!m_error_msg.empty()) {
				ImGui::Text("%s", m_error_msg.c_str());
			}
			if (m_file && !m_file->error_msg.empty()) {
				ImGui::Text("%s", m_file->error_msg.c_str());
			}
			if (ImGui::Button("OK")) {
				ImGui::CloseCurrentPopup();
			}
			ImGui::EndPopup();
		}
		if (m_lastFileOpenWasInvalid) {
			ImGui::OpenPopup("Error opening file");
			m_lastFileOpenWasInvalid = false;
		}
		ImGui::EndMainMenuBar();
	}

	if (open_file) {
		filesystem::path filepath;

		if (preset_filename) {
			filepath        = filesystem::u8path(preset_filename);
			preset_filename = NULL;
		} else {
			filepath = show_file_picker(true);

			ImGuiIO &io           = ImGui::GetIO();
			io.MouseDown[0]       = false;
			io.MouseClicked[0]    = false;
			io.MouseClickedPos[0] = ImVec2(0, 0);
		}

		if (!filepath.empty()) {
			LoadFile(filepath);
		}
	}

	ImGuiWindowFlags flags = ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove |
	                         ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoSavedSettings;

	// ImGui's keyboard navigation is disabled for the boardview area as we use our own key bindings
	ImGuiWindowFlags draw_surface_flags = flags | ImGuiWindowFlags_NoFocusOnAppearing | ImGuiWindowFlags_NoBringToFrontOnFocus |
		ImGuiWindowFlags_NoScrollWithMouse | ImGuiWindowFlags_NoNavInputs;

	/*
	 * Status footer
	 */
	m_status_height = (DPIF(10.0f) + ImGui::GetFontSize());
	ImGui::PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(DPIF(4.0f), DPIF(3.0f)));
	ImGui::PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
	ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 1.0f);
	ImGui::SetNextWindowPos(ImVec2(0, io.DisplaySize.y - m_status_height));
	ImGui::SetNextWindowSize(ImVec2(io.DisplaySize.x, m_status_height));
	ImGui::Begin("status", nullptr, flags | ImGuiWindowFlags_NoFocusOnAppearing);
	if (m_file && m_board && m_pinSelected) {
		auto pin = m_pinSelected;
		ImGui::Text("Part: %s   Pin: %s   Net: %s   Probe: %d   (%s.)",
		            pin->component->name.c_str(),
		            pin->name.c_str(),
		            pin->net->name.c_str(),
		            pin->net->number,
		            pin->component->mount_type_str().c_str());
	} else {
		ImVec2 spos = ImGui::GetMousePos();
		ImVec2 pos  = ScreenToCoord(spos.x, spos.y);
		if (config.showFPS == true) {
			ImGui::Text("FPS: %0.0f ", ImGui::GetIO().Framerate);
			ImGui::SameLine();
		}

		if (debug) {
			ImGui::Text("AnnID:%d ", m_annotation_clicked_id);
			ImGui::SameLine();
		}

		if (config.showPosition == true) {
			ImGui::Text("Position: %0.3f\", %0.3f\" (%0.2f, %0.2fmm)", pos.x / 1000, pos.y / 1000, pos.x * 0.0254, pos.y * 0.0254);
			ImGui::SameLine();
		}

		{
			if (m_validBoard) {
				ImVec2 s = ImGui::CalcTextSize(fhistory.history[0]);
				ImGui::SameLine(ImGui::GetWindowWidth() - s.x - 20);
				ImGui::Text("%s", fhistory.history[0]);
				ImGui::SameLine();
			}
		}
		ImGui::Text(" ");
	}
	ImGui::End();
	ImGui::PopStyleVar();
	ImGui::PopStyleVar();
	ImGui::PopStyleVar();

	if (!config.showInfoPanel) {
		m_board_surface = ImVec2(io.DisplaySize.x, io.DisplaySize.y - (m_status_height + m_menu_height));
	} else {
		m_board_surface = ImVec2(io.DisplaySize.x - m_info_surface.x, io.DisplaySize.y - (m_status_height + m_menu_height));
	}
	/*
	 * Drawing surface, where the actual PCB/board is plotted out
	 */
	ImGui::SetNextWindowPos(ImVec2(0, m_menu_height));
	if (io.DisplaySize.x != m_lastWidth || io.DisplaySize.y != m_lastHeight) {
		//		m_lastWidth   = io.DisplaySize.x;
		//		m_lastHeight  = io.DisplaySize.y;
		m_lastWidth   = m_board_surface.x;
		m_lastHeight  = m_board_surface.y;
		m_needsRedraw = true;
	}

	ImGui::SetNextWindowSize(m_board_surface);

	ImGui::PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
	ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 1.0f);
	ImGui::PushStyleColor(ImGuiCol_WindowBg, m_colors.backgroundColor);

	ImGui::Begin("surface", nullptr, draw_surface_flags);
	if (m_validBoard) {
		HandleInput();
		backgroundImage.render(*ImGui::GetWindowDrawList(),
			CoordToScreen(backgroundImage.x0(), backgroundImage.y0()),
			CoordToScreen(backgroundImage.x1(), backgroundImage.y1()),
			m_rotation);
		DrawBoard();
	}
	ImGui::End();
	ImGui::PopStyleColor();
	ImGui::PopStyleVar();

	// Overlay
	RenderOverlay();

	ImGui::PopStyleVar();

	HandlePDFBridgeSelection();

}